

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O3

void __thiscall glu::VarTokenizer::advance(VarTokenizer *this)

{
  byte bVar1;
  char *pcVar2;
  Token TVar3;
  TestError *this_00;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = this->m_tokenLen;
  iVar6 = this->m_tokenStart;
  iVar4 = iVar6 + iVar5;
  this->m_tokenStart = iVar4;
  this->m_token = TOKEN_LAST;
  this->m_tokenLen = 1;
  pcVar2 = this->m_str;
  bVar1 = pcVar2[iVar4];
  if (bVar1 < 0x5b) {
    if (bVar1 == 0) {
      TVar3 = TOKEN_END;
    }
    else {
      if (bVar1 != 0x2e) {
LAB_009bc26b:
        if ((byte)(bVar1 - 0x30) < 10) {
          this->m_token = TOKEN_NUMBER;
          if (9 < (byte)(pcVar2[iVar4 + 1] - 0x30U)) {
            return;
          }
          iVar5 = 2;
          do {
            this->m_tokenLen = iVar5;
            iVar6 = iVar4 + iVar5;
            iVar5 = iVar5 + 1;
          } while ((byte)(pcVar2[iVar6] - 0x30U) < 10);
          return;
        }
        if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unexpected character",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x50);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        this->m_token = TOKEN_IDENTIFIER;
        iVar6 = iVar6 + iVar5;
        iVar5 = 2;
        while( true ) {
          iVar6 = iVar6 + 1;
          bVar1 = pcVar2[iVar6];
          if ((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x5f && 9 < (byte)(bVar1 - 0x30)))
          break;
          this->m_tokenLen = iVar5;
          iVar5 = iVar5 + 1;
        }
        return;
      }
      TVar3 = TOKEN_PERIOD;
    }
  }
  else if (bVar1 == 0x5b) {
    TVar3 = TOKEN_LEFT_BRACKET;
  }
  else {
    if (bVar1 != 0x5d) goto LAB_009bc26b;
    TVar3 = TOKEN_RIGHT_BRACKET;
  }
  this->m_token = TVar3;
  return;
}

Assistant:

void VarTokenizer::advance (void)
{
	DE_ASSERT(m_token != TOKEN_END);

	m_tokenStart	+= m_tokenLen;
	m_token			 = TOKEN_LAST;
	m_tokenLen		 = 1;

	if (m_str[m_tokenStart] == '[')
		m_token = TOKEN_LEFT_BRACKET;
	else if (m_str[m_tokenStart] == ']')
		m_token = TOKEN_RIGHT_BRACKET;
	else if (m_str[m_tokenStart] == 0)
		m_token = TOKEN_END;
	else if (m_str[m_tokenStart] == '.')
		m_token = TOKEN_PERIOD;
	else if (isNum(m_str[m_tokenStart]))
	{
		m_token = TOKEN_NUMBER;
		while (isNum(m_str[m_tokenStart+m_tokenLen]))
			m_tokenLen += 1;
	}
	else if (isIdentifierChar(m_str[m_tokenStart]))
	{
		m_token = TOKEN_IDENTIFIER;
		while (isIdentifierChar(m_str[m_tokenStart+m_tokenLen]))
			m_tokenLen += 1;
	}
	else
		TCU_FAIL("Unexpected character");
}